

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  byte bVar2;
  size_type sVar3;
  reference ppcVar4;
  size_t sVar5;
  ostream *poVar6;
  persistence_computer_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>
  *this;
  reference pfVar7;
  vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_> *_complex;
  ostream *_max_entries;
  ostream *this_00;
  uint *puVar8;
  pointer poVar9;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> this_01;
  exception *e;
  persistence_computer_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>
  persistence_computer;
  unique_ptr<output_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>,_std::default_delete<output_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>_>_>
  output;
  vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>
  vietoris_rips_complex;
  pair<__gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>,___gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>_>
  value_range;
  index_t n;
  compressed_lower_distance_matrix dist;
  ifstream file_stream;
  size_t max_entries;
  const_iterator it;
  flagser_parameters params;
  named_arguments_t named_arguments;
  positional_arguments_t positional_arguments;
  cli_arguments_t arguments;
  coefficient_t modulus;
  value_t threshold;
  index_t dim_min;
  index_t dim_max;
  file_format format;
  cli_arguments_t *in_stack_fffffffffffff848;
  flagser_parameters *in_stack_fffffffffffff850;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> in_stack_fffffffffffff858;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> in_stack_fffffffffffff860;
  undefined8 in_stack_fffffffffffff870;
  file_format format_00;
  istream *in_stack_fffffffffffff878;
  compressed_distance_matrix<(compressed_matrix_layout)0> *_distance_matrix;
  flagser_parameters *in_stack_fffffffffffff8c8;
  char **in_stack_fffffffffffffa10;
  int in_stack_fffffffffffffa1c;
  undefined1 local_5c0 [108];
  int local_554;
  float *local_550;
  float *local_548;
  pair<__gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>,___gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>_>
  local_540;
  int local_52c;
  compressed_distance_matrix<(compressed_matrix_layout)0> local_528;
  undefined1 local_4f8 [520];
  undefined8 local_2f0;
  allocator local_2e1;
  string local_2e0 [39];
  allocator local_2b9;
  string local_2b8 [39];
  allocator local_291;
  string local_290 [39];
  allocator local_269;
  string local_268 [39];
  allocator local_241;
  string local_240 [8];
  named_arguments_t *in_stack_fffffffffffffdc8;
  flagser_parameters *in_stack_fffffffffffffdd0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
  local_220;
  allocator local_211;
  string local_210 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
  local_1f0;
  __node_type *local_1e8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
  local_1e0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
  local_1d8;
  allocator local_1c9;
  string local_1c8 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
  local_1a8;
  ushort local_1a0;
  undefined2 local_19c;
  undefined4 local_198;
  undefined8 local_190;
  vector<const_char_*,_std::allocator<const_char_*>_> local_a0 [5];
  undefined2 local_22;
  float local_20;
  undefined4 local_1c;
  uint local_18;
  int local_14;
  int local_4;
  
  format_00 = (file_format)((ulong)in_stack_fffffffffffff870 >> 0x20);
  local_4 = 0;
  local_14 = 2;
  local_18 = 1;
  local_1c = 0;
  local_20 = std::numeric_limits<float>::max();
  local_22 = 2;
  parse_arguments_abi_cxx11_(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa10);
  get_positional_arguments(in_stack_fffffffffffff848);
  get_named_arguments(in_stack_fffffffffffff848);
  flagser_parameters::flagser_parameters(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c8,"help",&local_1c9);
  local_1a8._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
       ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
               *)in_stack_fffffffffffff848,(key_type *)0x14b755);
  local_1d8._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
              *)in_stack_fffffffffffff848);
  bVar1 = std::__detail::operator!=(&local_1a8,&local_1d8);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  if (bVar1) {
    print_usage_and_exit(0);
  }
  sVar3 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(local_a0);
  if (sVar3 == 0) {
    print_usage_and_exit(0);
  }
  std::__detail::
  _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_false,_true>
  ::_Node_const_iterator
            ((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_false,_true>
              *)0x14b8cf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_210,"format",&local_211);
  local_1f0._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
       ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
               *)in_stack_fffffffffffff848,(key_type *)0x14b919);
  std::__detail::
  _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_false,_true>
  ::_Node_const_iterator
            ((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_false,_true>
              *)in_stack_fffffffffffff850,
             (_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_false,_true>
              *)in_stack_fffffffffffff848);
  local_1e0._M_cur = local_1e8;
  local_220._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
              *)in_stack_fffffffffffff848);
  bVar1 = std::__detail::operator!=(&local_1e0,&local_220);
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  if (bVar1) {
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_false,_true>
    ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_false,_true>
                  *)0x14b9c0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_240,"lower-distance",&local_241);
    bVar1 = std::operator==((char *)in_stack_fffffffffffff850,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff848);
    std::__cxx11::string::~string(local_240);
    std::allocator<char>::~allocator((allocator<char> *)&local_241);
    if (bVar1) {
      local_14 = 0;
    }
    else {
      std::__detail::
      _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_false,_true>
      ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_false,_true>
                    *)0x14baf6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_268,"upper-distance",&local_269);
      bVar1 = std::operator==((char *)in_stack_fffffffffffff850,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff848);
      std::__cxx11::string::~string(local_268);
      std::allocator<char>::~allocator((allocator<char> *)&local_269);
      if (bVar1) {
        local_14 = 1;
      }
      else {
        std::__detail::
        _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_false,_true>
        ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_false,_true>
                      *)0x14bbe0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_290,"distance",&local_291);
        bVar1 = std::operator==((char *)in_stack_fffffffffffff850,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff848);
        std::__cxx11::string::~string(local_290);
        std::allocator<char>::~allocator((allocator<char> *)&local_291);
        if (bVar1) {
          local_14 = 2;
        }
        else {
          std::__detail::
          _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_false,_true>
          ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_false,_true>
                        *)0x14bcca);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_2b8,"point-cloud",&local_2b9);
          bVar1 = std::operator==((char *)in_stack_fffffffffffff850,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffff848);
          std::__cxx11::string::~string(local_2b8);
          std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
          if (bVar1) {
            local_14 = 3;
          }
          else {
            std::__detail::
            _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_false,_true>
            ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_false,_true>
                          *)0x14bdb4);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_2e0,"dipha",&local_2e1);
            bVar1 = std::operator==((char *)in_stack_fffffffffffff850,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffff848);
            std::__cxx11::string::~string(local_2e0);
            std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
            if (bVar1) {
              local_14 = 4;
            }
            else {
              poVar6 = std::operator<<((ostream *)&std::cerr,"The input format ");
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_14);
              poVar6 = std::operator<<(poVar6," is not supported.");
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              print_usage_and_exit(0);
            }
          }
        }
      }
    }
  }
  local_18 = (uint)local_1a0;
  local_20 = (float)local_198;
  local_22 = local_19c;
  std::numeric_limits<unsigned_long>::max();
  local_2f0 = local_190;
  ppcVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](local_a0,0);
  std::ifstream::ifstream(local_4f8,*ppcVar4,_S_in);
  ppcVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](local_a0,0);
  if ((*ppcVar4 != (value_type)0x0) && (bVar2 = std::ios::fail(), (bVar2 & 1) != 0)) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"couldn\'t open file ");
    ppcVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](local_a0,0);
    poVar6 = std::operator<<(poVar6,*ppcVar4);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    exit(-1);
  }
  std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](local_a0,0);
  read_file(in_stack_fffffffffffff878,format_00);
  sVar5 = compressed_distance_matrix<(compressed_matrix_layout)0>::size
                    ((compressed_distance_matrix<(compressed_matrix_layout)0> *)0x14c0b8);
  local_52c = (int)sVar5;
  poVar6 = std::operator<<((ostream *)&std::cout,"distance matrix with ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_52c);
  poVar6 = std::operator<<(poVar6," points");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  _distance_matrix = &local_528;
  local_548 = (float *)std::vector<float,_std::allocator<float>_>::begin
                                 ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff848
                                 );
  local_550 = (float *)std::vector<float,_std::allocator<float>_>::end
                                 ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff848
                                 );
  local_540 = std::
              minmax_element<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
                        (in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  this_01 = local_540.second._M_current;
  this = (persistence_computer_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>
          *)std::operator<<((ostream *)&std::cout,"value range: [");
  pfVar7 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
           operator*(&local_540.first);
  _complex = (vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_> *)
             std::ostream::operator<<(this,*pfVar7);
  poVar6 = std::operator<<((ostream *)_complex,",");
  pfVar7 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
           operator*(&local_540.second);
  _max_entries = (ostream *)std::ostream::operator<<(poVar6,*pfVar7);
  this_00 = std::operator<<(_max_entries,"]");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  local_554 = local_52c + -2;
  puVar8 = (uint *)std::min<int>((int *)&local_18,&local_554);
  local_18 = *puVar8;
  vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>::
  vietoris_rips_complex_t
            ((vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_> *)
             this_01._M_current,_distance_matrix,(unsigned_short)((ulong)this >> 0x30),
             (coefficient_t)((ulong)this >> 0x20));
  get_output<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>>>
            (in_stack_fffffffffffff8c8);
  poVar9 = std::
           unique_ptr<output_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>,_std::default_delete<output_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>_>_>
           ::operator->((unique_ptr<output_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>,_std::default_delete<output_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>_>_>
                         *)0x14c2b6);
  (*poVar9->_vptr_output_t[2])(poVar9,local_5c0);
  std::
  unique_ptr<output_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>,_std::default_delete<output_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>_>_>
  ::get((unique_ptr<output_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>,_std::default_delete<output_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>_>_>
         *)in_stack_fffffffffffff850);
  persistence_computer_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>
  ::persistence_computer_t
            (this,_complex,
             (output_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>
              *)poVar6,(size_t)_max_entries,(int)((ulong)this_00 >> 0x20),SUB84(this_00,0));
  persistence_computer_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>
  ::compute_persistence
            ((persistence_computer_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>
              *)this_01._M_current,(unsigned_short)((ulong)_distance_matrix >> 0x30),
             (unsigned_short)((ulong)_distance_matrix >> 0x20),
             SUB81((ulong)_distance_matrix >> 0x18,0));
  poVar9 = std::
           unique_ptr<output_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>,_std::default_delete<output_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>_>_>
           ::operator->((unique_ptr<output_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>,_std::default_delete<output_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>_>_>
                         *)0x14c33b);
  (*poVar9->_vptr_output_t[0xb])();
  persistence_computer_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>
  ::~persistence_computer_t
            ((persistence_computer_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>
              *)in_stack_fffffffffffff850);
  std::
  unique_ptr<output_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>,_std::default_delete<output_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>_>_>
  ::~unique_ptr((unique_ptr<output_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>,_std::default_delete<output_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>_>_>
                 *)this_00);
  vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>::
  ~vietoris_rips_complex_t
            ((vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_> *)
             in_stack_fffffffffffff850);
  compressed_distance_matrix<(compressed_matrix_layout)0>::~compressed_distance_matrix
            ((compressed_distance_matrix<(compressed_matrix_layout)0> *)in_stack_fffffffffffff850);
  std::ifstream::~ifstream(local_4f8);
  flagser_parameters::~flagser_parameters(in_stack_fffffffffffff850);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
                    *)0x14c3a4);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)this_00);
  std::
  pair<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>_>
  ::~pair((pair<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>_>
           *)in_stack_fffffffffffff850);
  return local_4;
}

Assistant:

int main(int argc, char** argv) {
	file_format format = DISTANCE_MATRIX;

	index_t dim_max = 1;
	index_t dim_min = 0;
	value_t threshold = std::numeric_limits<value_t>::max();

#ifdef USE_COEFFICIENTS
	coefficient_t modulus = 2;
#else
	const coefficient_t modulus = 2;
#endif

	try {
		auto arguments = parse_arguments(argc, argv);
		auto positional_arguments = get_positional_arguments(arguments);
		auto named_arguments = get_named_arguments(arguments);
		auto params = flagser_parameters(named_arguments);

		if (named_arguments.find("help") != named_arguments.end()) { print_usage_and_exit(-1); }
		if (positional_arguments.size() == 0) print_usage_and_exit(-1);

		named_arguments_t::const_iterator it;
		if ((it = named_arguments.find("format")) != named_arguments.end()) {
			if (it->second == std::string("lower-distance"))
				format = LOWER_DISTANCE_MATRIX;
			else if (it->second == std::string("upper-distance"))
				format = UPPER_DISTANCE_MATRIX;
			else if (it->second == std::string("distance"))
				format = DISTANCE_MATRIX;
			else if (it->second == std::string("point-cloud"))
				format = POINT_CLOUD;
			else if (it->second == std::string("dipha"))
				format = DIPHA;
			else {
				std::cerr << "The input format " << format << " is not supported." << std::endl;
				print_usage_and_exit(-1);
			}
		}

		dim_max = params.max_dimension;
		threshold = params.threshold;

#ifdef USE_COEFFICIENTS
		modulus = params.modulus;
#endif

		size_t max_entries = std::numeric_limits<size_t>::max();
		max_entries = params.max_entries;

		std::ifstream file_stream(positional_arguments[0]);
		if (positional_arguments[0] && file_stream.fail()) {
			std::cerr << "couldn't open file " << positional_arguments[0] << std::endl;
			exit(-1);
		}

		compressed_lower_distance_matrix dist = read_file(positional_arguments[0] ? file_stream : std::cin, format);

		index_t n = index_t(dist.size());

		std::cout << "distance matrix with " << n << " points" << std::endl;

		auto value_range = std::minmax_element(dist.distances.begin(), dist.distances.end());
		std::cout << "value range: [" << *value_range.first << "," << *value_range.second << "]" << std::endl;

		dim_max = std::min(dim_max, n - 2);

		vietoris_rips_complex_t<decltype(dist)> vietoris_rips_complex(dist, dim_max, modulus);
		auto output = get_output<decltype(vietoris_rips_complex)>(params);
		output->set_complex(&vietoris_rips_complex);

		persistence_computer_t<decltype(vietoris_rips_complex)> persistence_computer(
		    vietoris_rips_complex, output.get(), max_entries, modulus, threshold);
		persistence_computer.compute_persistence(dim_min, dim_max, false);
		output->print_aggregated_results();
	} catch (const std::exception& e) { std::cout << e.what() << std::endl; }
}